

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer *
Serialize<PClassActor>(FSerializer *arc,char *key,PClassActor **clst,PClassActor **def)

{
  FWriter *this;
  bool bVar1;
  Value *this_00;
  Ch *cc;
  char *pcVar2;
  PClassActor *pPVar3;
  bool local_39;
  Value *val;
  PClassActor **def_local;
  PClassActor **clst_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (PClassActor **)0x0)) || (*clst != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*clst == (PClassActor *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        this = arc->w;
        pcVar2 = FName::GetChars(&((*clst)->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName);
        FWriter::String(this,pcVar2);
      }
    }
  }
  else {
    this_00 = FReader::FindKey(arc->r,key);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      local_39 = true;
      if (!bVar1) {
        local_39 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsNull(this_00);
      }
      if (local_39 == false) {
        __assert_fail("val->IsString() || val->IsNull()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x723,
                      "FSerializer &Serialize(FSerializer &, const char *, PClassActor *&, PClassActor **)"
                     );
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      if (bVar1) {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar2 = UnicodeToString(cc);
        pPVar3 = PClass::FindActor(pcVar2);
        *clst = pPVar3;
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsNull(this_00);
        if (bVar1) {
          *clst = (PClassActor *)0x0;
        }
        else {
          Printf("\x1cGstring type expected for \'%s\'",key);
          *clst = (PClassActor *)0x0;
          arc->mErrors = arc->mErrors + 1;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, PClassActor *&clst, PClassActor **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || clst != *def)
		{
			arc.WriteKey(key);
			if (clst == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(clst->TypeName.GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsString() || val->IsNull());
			if (val->IsString())
			{
				clst = PClass::FindActor(UnicodeToString(val->GetString()));
			}
			else if (val->IsNull())
			{
				clst = nullptr;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				clst = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}